

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O2

void InitSituation(Situation *situation)

{
  pointer pMVar1;
  
  memset(situation,0,0x17c);
  pMVar1 = (situation->moves_stack).super__Vector_base<Movement,_std::allocator<Movement>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((situation->moves_stack).super__Vector_base<Movement,_std::allocator<Movement>_>._M_impl.
      super__Vector_impl_data._M_finish != pMVar1) {
    (situation->moves_stack).super__Vector_base<Movement,_std::allocator<Movement>_>._M_impl.
    super__Vector_impl_data._M_finish = pMVar1;
  }
  std::vector<Movement,_std::allocator<Movement>_>::reserve(&situation->moves_stack,300);
  return;
}

Assistant:

void InitSituation(Situation & situation){
    // 清空棋子棋盘数组
    memset(situation.current_board, 0, sizeof(UINT8) * 256);
    memset(situation.current_pieces, 0, sizeof(UINT8) * 48);
    // 清空位行位列
    memset(situation.bit_col, 0, sizeof(UINT16) * 16);
    memset(situation.bit_row, 0, sizeof(UINT16) * 16);
    // 初始化局面价值 玩家
    situation.current_player = RED;
    situation.value[RED] = 0;
    situation.value[BLACK] = 0;
    // 清空着法栈
    situation.moves_stack.clear();
    situation.moves_stack.reserve(300);
}